

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LandmarkMapper.hpp
# Opt level: O1

optional<int>
eos::core::get_vertex_index
          (string *landmark_name,LandmarkMapper *landmark_mapper,
          optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          *landmark_definitions)

{
  char *pcVar1;
  int iVar2;
  pointer pcVar3;
  undefined8 __nptr;
  const_iterator cVar4;
  int *piVar5;
  _Alloc_hider _Var6;
  _Alloc_hider _Var7;
  long lVar8;
  ulong uVar9;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  converted_name;
  undefined1 local_78 [32];
  bool local_58;
  string local_50;
  _Alloc_hider local_30;
  
  pcVar3 = (landmark_name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + landmark_name->_M_string_length);
  LandmarkMapper::convert
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78,landmark_mapper,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __nptr = local_78._0_8_;
  if (local_58 != false) {
    pcVar1 = (char *)(local_78._0_8_ + local_78._8_8_);
    _Var6._M_p = (pointer)local_78._0_8_;
    if (0 < (long)local_78._8_8_ >> 2) {
      _Var6._M_p = (pointer)((local_78._8_8_ & 0xfffffffffffffffc) + local_78._0_8_);
      lVar8 = ((long)local_78._8_8_ >> 2) + 1;
      _Var7._M_p = (pointer)(local_78._0_8_ + 3);
      do {
        if ((int)_Var7._M_p[-3] - 0x3aU < 0xfffffff6) {
          _Var7._M_p = _Var7._M_p + -3;
          goto LAB_0015b2d4;
        }
        if ((int)_Var7._M_p[-2] - 0x3aU < 0xfffffff6) {
          _Var7._M_p = _Var7._M_p + -2;
          goto LAB_0015b2d4;
        }
        if ((int)_Var7._M_p[-1] - 0x3aU < 0xfffffff6) {
          _Var7._M_p = _Var7._M_p + -1;
          goto LAB_0015b2d4;
        }
        if ((int)*_Var7._M_p - 0x3aU < 0xfffffff6) goto LAB_0015b2d4;
        lVar8 = lVar8 + -1;
        _Var7._M_p = _Var7._M_p + 4;
      } while (1 < lVar8);
    }
    lVar8 = (long)pcVar1 - (long)_Var6._M_p;
    if (lVar8 == 1) {
LAB_0015b2b3:
      _Var7._M_p = _Var6._M_p;
      if (0xfffffff5 < (int)*_Var6._M_p - 0x3aU) {
        _Var7._M_p = pcVar1;
      }
    }
    else if (lVar8 == 2) {
LAB_0015b2a5:
      _Var7._M_p = _Var6._M_p;
      if (0xfffffff5 < (int)*_Var6._M_p - 0x3aU) {
        _Var6._M_p = _Var6._M_p + 1;
        goto LAB_0015b2b3;
      }
    }
    else {
      _Var7._M_p = pcVar1;
      if ((lVar8 == 3) && (_Var7._M_p = _Var6._M_p, 0xfffffff5 < (int)*_Var6._M_p - 0x3aU)) {
        _Var6._M_p = _Var6._M_p + 1;
        goto LAB_0015b2a5;
      }
    }
LAB_0015b2d4:
    if (_Var7._M_p == pcVar1) {
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      landmark_definitions =
           (optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            *)strtol((char *)__nptr,&local_30._M_p,10);
      if (local_30._M_p == (pointer)__nptr) {
        std::__throw_invalid_argument("stoi");
      }
      else if (((optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                 *)(long)(int)landmark_definitions == landmark_definitions) && (*piVar5 != 0x22)) {
        if (*piVar5 == 0) {
          *piVar5 = iVar2;
        }
        uVar9 = 0x100000000;
        goto LAB_0015b35c;
      }
      std::__throw_out_of_range("stoi");
LAB_0015b3af:
      std::__throw_bad_optional_access();
    }
    if ((landmark_definitions->
        super__Optional_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
        ._M_engaged == true) {
      cVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)landmark_definitions,(key_type *)local_78);
      if ((landmark_definitions->
          super__Optional_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
          ._M_engaged == false) goto LAB_0015b3af;
      if (cVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
          ._M_cur != (__node_type *)0x0) {
        uVar9 = 0x100000000;
        landmark_definitions =
             (optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
              *)(ulong)*(uint *)((long)cVar4.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                       ._M_cur + 0x28);
        goto LAB_0015b35c;
      }
    }
  }
  uVar9 = 0;
LAB_0015b35c:
  if ((local_58 == true) && (local_58 = false, (undefined1 *)local_78._0_8_ != local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  return (_Optional_base<int,_true,_true>)
         (_Optional_base<int,_true,_true>)(uVar9 | (ulong)landmark_definitions & 0xffffffff);
}

Assistant:

inline cpp17::optional<int>
get_vertex_index(const std::string landmark_name, const core::LandmarkMapper& landmark_mapper,
                 const cpp17::optional<std::unordered_map<std::string, int>>& landmark_definitions)
{
    const auto converted_name = landmark_mapper.convert(landmark_name);
    if (!converted_name)
    { // no mapping defined for the current landmark
        return std::nullopt;
    }
    // If the MorphableModel does not contain landmark definitions, we expect the user to have given us
    // direct mappings (e.g. directly from ibug identifiers to vertex ids). If the model does contain
    // landmark definitions, we expect the user to use mappings from their landmark identifiers (e.g.
    // ibug) to the landmark definitions. Users may also include direct mappings to create a "hybrid" mapping.
    // Todo: This might be worth mentioning in the function documentation of fit_shape_and_pose.
    int vertex_idx;
    if (std::all_of(converted_name.value().begin(), converted_name.value().end(), ::isdigit))
    {
        vertex_idx = std::stoi(converted_name.value());
    } else
    {
        if (landmark_definitions)
        {
            const auto found_vertex_idx = landmark_definitions.value().find(converted_name.value());
            if (found_vertex_idx != std::end(landmark_definitions.value()))
            {
                vertex_idx = found_vertex_idx->second;
            } else
            {
                return cpp17::nullopt;
            }
        } else
        {
            return cpp17::nullopt;
        }
    }
    return vertex_idx;
}